

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

int __thiscall position::see_move(position *this,Move *m)

{
  byte bVar1;
  Piece PVar2;
  int iVar3;
  long lVar4;
  pointer pSVar5;
  pointer pSVar6;
  bool bVar7;
  int iVar8;
  U64 UVar9;
  Piece PVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  SeePiece *pSVar16;
  ulong uVar17;
  ulong uVar18;
  Color CVar19;
  ulong uVar20;
  SeePiece *pSVar21;
  Square to;
  U64 pieces;
  vector<SeePiece,_std::allocator<SeePiece>_> white_list;
  vector<SeePiece,_std::allocator<SeePiece>_> black_list;
  Square wks;
  Square bks;
  int local_a8;
  SeePiece local_a4;
  Square local_9c;
  SeePiece *local_98;
  ulong local_90;
  vector<SeePiece,_std::allocator<SeePiece>_> local_88;
  vector<SeePiece,_std::allocator<SeePiece>_> local_68;
  ulong local_50;
  Color local_44;
  Color local_40;
  Color local_3c;
  Square local_38;
  Square local_34;
  
  local_34 = (this->ifo).ks[1];
  local_38 = (this->ifo).ks[0];
  local_9c = (Square)m->t;
  bVar1 = m->f;
  uVar20 = (this->pcs).bycolor._M_elems[0];
  local_50 = (this->pcs).bycolor._M_elems[1];
  local_90 = local_50 | uVar20;
  local_98 = (SeePiece *)(uVar20 ^ (this->ifo).pinned[0]);
  local_50 = local_50 ^ (this->ifo).pinned[1];
  local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_start = (SeePiece *)0x0;
  local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SeePiece *)0x0;
  local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_start = (SeePiece *)0x0;
  local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SeePiece *)0x0;
  PVar10 = no_piece;
LAB_00121521:
  UVar9 = attackers_of(this,&local_9c,&local_90);
  pSVar6 = local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar5 = local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar20 = UVar9 & local_90;
  if (uVar20 != 0) {
    local_90 = local_90 ^ uVar20;
    local_a4.p = pawn;
    local_3c = black;
    bVar7 = is_attacked(this,&local_38,&local_a4.p,&local_3c,local_90);
    if (bVar7) {
      local_a8 = 0;
      goto LAB_001218a8;
    }
    local_40 = black;
    local_44 = white;
    bVar7 = is_attacked(this,&local_34,&local_40,&local_44,local_90);
    local_a8 = 0;
    if (bVar7) goto LAB_001218a8;
    for (uVar17 = uVar20 & (ulong)local_98; uVar17 != 0; uVar17 = uVar17 & uVar17 - 1) {
      lVar4 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      if ((uint)lVar4 == (uint)bVar1) {
        PVar10 = (this->pcs).piece_on._M_elems[lVar4];
      }
      else {
        local_a4.p = (this->pcs).piece_on._M_elems[lVar4];
        local_a4.score =
             (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_a4.p];
        std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                  (&local_88,&local_a4);
      }
    }
    uVar20 = uVar20 & local_50;
    if (uVar20 != 0) {
      do {
        lVar4 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        if ((uint)lVar4 == (uint)bVar1) {
          PVar10 = (this->pcs).piece_on._M_elems[lVar4];
        }
        else {
          local_a4.p = (this->pcs).piece_on._M_elems[lVar4];
          local_a4.score =
               (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_a4.p];
          std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                    (&local_68,&local_a4);
        }
        uVar20 = uVar20 & uVar20 - 1;
      } while (uVar20 != 0);
    }
    if (((local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
          super__Vector_impl_data._M_start) ||
        (local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
         super__Vector_impl_data._M_start)) || (PVar10 != no_piece)) goto LAB_00121521;
    goto LAB_001218a8;
  }
  if (local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar20 = (long)local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar4 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar6);
  }
  pSVar6 = local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar5 = local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar20 = (long)local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar4 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar6);
  }
  CVar19 = (this->ifo).stm;
  local_a4.p = PVar10;
  if (CVar19 == black) {
    local_a4.score = 0;
    std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
              (&local_68,
               (const_iterator)
               local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,&local_a4);
  }
  else {
    local_a4.score = 0;
    std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
              (&local_88,
               (const_iterator)
               local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
               super__Vector_impl_data._M_start,&local_a4);
  }
  local_98 = local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar20 = (long)local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  uVar17 = (long)local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_50 = (ulong)local_9c;
  uVar11 = 0;
  uVar13 = 0;
  uVar14 = 0;
  iVar12 = 0;
  do {
    if (uVar11 == 0) {
      PVar10 = (this->pcs).piece_on._M_elems[local_50];
      iVar8 = 0;
      uVar11 = 1;
      if ((ulong)PVar10 != 7) {
        local_a8 = 0;
        if (PVar10 == king) goto LAB_001218a8;
        iVar8 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[PVar10];
      }
    }
    else {
      uVar15 = (ulong)uVar13;
      local_a8 = iVar12;
      if ((uVar20 <= uVar15) || (uVar18 = (ulong)uVar14, uVar17 <= uVar18)) goto LAB_001218a8;
      if (CVar19 == white) {
        pSVar21 = local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar18;
        uVar14 = uVar14 + 1;
        pSVar16 = local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar15;
      }
      else {
        if (CVar19 != black) goto LAB_001218a8;
        pSVar21 = local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar15;
        uVar13 = uVar13 + 1;
        pSVar16 = local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar18;
      }
      PVar10 = pSVar16->p;
      if ((ulong)PVar10 == 7) goto LAB_001218a8;
      PVar2 = pSVar21->p;
      iVar3 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[PVar2];
      if (iVar3 < mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[PVar10] || (ulong)PVar2 == 5) {
        uVar15 = uVar17;
        uVar18 = uVar20;
        if (PVar10 == king) {
          if (CVar19 == white) {
            if (uVar14 < uVar17) goto LAB_001218a8;
            if (PVar2 == king) goto LAB_0012187c;
            goto joined_r0x00121889;
          }
          if (uVar13 < uVar20) goto LAB_001218a8;
          if (PVar2 == king) goto LAB_00121858;
        }
        else if (PVar2 == king) {
          if (CVar19 != white) {
LAB_00121858:
            uVar18 = (ulong)uVar14;
joined_r0x00121889:
            if (uVar18 < uVar17) goto LAB_001218a8;
            goto LAB_0012188b;
          }
LAB_0012187c:
          uVar15 = (ulong)uVar13;
        }
        else if (CVar19 == white) goto joined_r0x00121889;
        if (uVar15 < uVar20) {
LAB_001218a8:
          if (local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
              super__Vector_impl_data._M_start != (SeePiece *)0x0) {
            operator_delete(local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl
                            .super__Vector_impl_data._M_start,
                            (long)local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
              super__Vector_impl_data._M_start != (SeePiece *)0x0) {
            operator_delete(local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl
                            .super__Vector_impl_data._M_start,
                            (long)local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          return local_a8;
        }
      }
LAB_0012188b:
      iVar8 = -iVar3;
      if ((uVar11 & 1) == 0) {
        iVar8 = iVar3;
      }
      uVar11 = uVar11 + 1;
    }
    iVar12 = iVar12 + iVar8;
    CVar19 = CVar19 ^ black;
  } while( true );
}

Assistant:

int position::see_move(const Move& m) const {

	Square bks = king_square(black);
	Square wks = king_square(white);
	Square to = Square(m.t);
	Square from = Square(m.f);
	U64 pieces = all_pieces();
	U64 attackers = 0ULL;

	U64 white_bb = get_pieces<white>() ^ pinned<white>();
	U64 black_bb = get_pieces<black>() ^ pinned<black>();

	std::vector<SeePiece> black_list;
	std::vector<SeePiece> white_list;
	Piece atkr = Piece::no_piece;

	while (true) { // while loop for pieces behind currently attacking pieces
		U64 a = attackers_of(to, pieces) & pieces;
		if (a) {
			pieces ^= a;

			if (is_attacked(wks, white, black, pieces) || is_attacked(bks, black, white, pieces))
			{
				return 0; // let search handle discovered checking sequences
			}

			attackers |= a;
		}
		else break;

		U64 white_attackers = a & white_bb;
		if (white_attackers) {
			while (white_attackers) {
				Square s = Square(bits::pop_lsb(white_attackers));
				if (s == from) {
					atkr = piece_on(Square(s));
					continue; // first attacker is handled below
				}
				white_list.emplace_back(SeePiece(piece_on(s), mvals[piece_on(s)]));
			}
		}

		U64 black_attackers = a & black_bb;
		if (black_attackers) {
			while (black_attackers) {
				Square s = Square(bits::pop_lsb(black_attackers));
				if (s == from) {
					atkr = piece_on(s);
					continue;
				}
				black_list.emplace_back(SeePiece(piece_on(s), mvals[piece_on(s)]));
			}
		}

		if (white_list.size() == 0 && black_list.size() == 0 && atkr == Piece::no_piece) return 0;
	}

	std::sort(white_list.begin(), white_list.end());
	std::sort(black_list.begin(), black_list.end());


	int i = 0;
	unsigned w = 0;
	unsigned b = 0;
	Color color = to_move();


	if (color == black) { black_list.insert(black_list.begin(), SeePiece(atkr, 0)); }
	else { white_list.insert(white_list.begin(), SeePiece(atkr, 0)); }

	int score = 0;
	int prev = score;

	while (true) {

		Piece victim = Piece::no_piece;
		if (i == 0) {
			Piece v = piece_on(to);
			if (v == Piece::king) return 0; // illegal
			score += (v == Piece::no_piece ? 0 : mvals[v]);
			color = Color(color ^ 1);
			prev = score;
			++i;
			continue;
		}

		if ((w >= white_list.size() || b >= black_list.size())) break;

		victim = (color == white ? black_list[b++].p : white_list[w++].p);

		int av = -1;
		Piece attacker = Piece::no_piece;
		if (color == white && w < white_list.size()) {
			attacker = white_list[w].p;
			av = mvals[attacker];
		}
		else if (color == black && b < black_list.size()) {
			attacker = black_list[b].p;
			av = mvals[attacker];
		}

		if (attacker == Piece::no_piece) break;


		color = Color(color ^ 1);
		int vv = mvals[victim];



		if (vv < av || victim == king) {
			if (attacker == king) {
				if ((color == black && b < black_list.size()) ||
					(color == white && w < white_list.size())) {
					return score; // illegal
				}
			}


			if ((victim == king && ((color == black && w < white_list.size()) || (color == white && b < black_list.size()))) ||
				(victim != king && ((color == black && (black_list.size() > white_list.size())) ||
					(color == white && (white_list.size() > black_list.size()))))) {
				score = prev;
				return score;
			}
		}
		score += ((i & 1) == 1 ? -vv : vv);
		++i;
		prev = score;
	}

	return score;
}